

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O2

REF_STATUS
ref_fixture_hex_brick_args_grid
          (REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,REF_DBL x0,REF_DBL x1,REF_DBL y0,
          REF_DBL y1,REF_DBL z0,REF_DBL z1,REF_INT l,REF_INT m,REF_INT n,REF_INT l0)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  undefined8 uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  undefined4 in_register_00000084;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  ulong local_120;
  REF_INT hex [8];
  REF_INT quad [5];
  REF_INT cell;
  ulong local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  int local_b4;
  ulong local_b0;
  REF_GRID_conflict local_a8;
  ulong local_a0;
  REF_DBL local_98;
  REF_DBL local_90;
  double local_88;
  double local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  uint local_5c;
  uint local_58;
  REF_INT node;
  ulong local_50;
  REF_NODE local_48;
  long local_40;
  ulong local_38;
  
  local_a0 = CONCAT44(in_register_00000084,n);
  uVar15 = (ulong)(uint)l;
  uVar4 = 0;
  if (0 < l0) {
    uVar4 = l0;
  }
  uVar16 = l - 1;
  if ((int)uVar16 <= (int)uVar4) {
    uVar4 = uVar16;
  }
  local_d0 = y1;
  local_c8 = x1;
  local_c0 = z0;
  local_88 = x0;
  local_80 = y0;
  uVar3 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar3 == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node = pRVar1->node;
    iVar8 = (int)local_a0;
    local_50 = (ulong)uVar16;
    if (pRVar1->mpi->id == 0) {
      local_c8 = (local_c8 - local_88) / (double)(int)uVar16;
      local_70 = (ulong)(m - 1U);
      dVar23 = (local_d0 - local_80) / (double)(int)(m - 1U);
      local_78 = (ulong)(iVar8 - 1U);
      dVar21 = z1 - local_c0;
      lVar12 = 0;
      uVar20 = 0;
      if (0 < l) {
        uVar20 = (ulong)(uint)l;
      }
      uVar14 = 0;
      if (0 < m) {
        uVar14 = (ulong)(uint)m;
      }
      uVar10 = 0;
      if (0 < iVar8) {
        uVar10 = local_a0 & 0xffffffff;
      }
      local_d8 = (ulong)(uint)(m * l);
      local_58 = (uint)uVar14;
      local_5c = (uint)uVar10;
      iVar5 = 0;
      dVar22 = local_c0;
      dVar24 = local_80;
      local_d0 = dVar23;
      local_b0 = (ulong)(uint)m;
      local_a8 = pRVar1;
      local_68 = (ulong)uVar4;
      local_38 = uVar15;
      while (uVar18 = local_b0, iVar5 != (int)uVar10) {
        local_98 = (double)iVar5 * (dVar21 / (double)(int)(iVar8 - 1U)) + dVar22;
        local_b4 = iVar5;
        local_40 = lVar12;
        for (iVar17 = 0; iVar17 != (int)uVar14; iVar17 = iVar17 + 1) {
          local_90 = (double)iVar17 * dVar23 + dVar24;
          for (uVar14 = 0; uVar20 != uVar14; uVar14 = uVar14 + 1) {
            uVar4 = ref_node_add(ref_node,(long)((int)lVar12 + (int)uVar14),&node);
            if (uVar4 != 0) {
              uVar20 = (ulong)uVar4;
              pcVar13 = "node";
              uVar9 = 0x514;
              goto LAB_0012c6b4;
            }
            pRVar2 = ref_node->real;
            lVar7 = (long)node;
            pRVar2[lVar7 * 0xf] = (double)(int)uVar14 * local_c8 + local_88;
            pRVar2[lVar7 * 0xf + 1] = local_90;
            pRVar2[lVar7 * 0xf + 2] = local_98;
            dVar22 = local_c0;
            dVar23 = local_d0;
            dVar24 = local_80;
          }
          lVar12 = lVar12 + local_38;
          uVar14 = (ulong)local_58;
          uVar10 = (ulong)local_5c;
        }
        lVar12 = local_40 + local_d8;
        iVar5 = local_b4 + 1;
      }
      iVar5 = (int)local_b0;
      iVar17 = iVar5 + 1;
      local_98 = (REF_DBL)CONCAT44(local_98._4_4_,iVar17);
      iVar17 = l * iVar17;
      iVar19 = 0;
      iVar8 = 1;
      uVar14 = local_d8;
      local_120 = uVar15;
      local_48 = ref_node;
      while (iVar8 < (int)local_a0) {
        local_90 = (REF_DBL)CONCAT44(local_90._4_4_,iVar8);
        local_80 = (double)CONCAT44(local_80._4_4_,(int)local_120);
        local_c8 = (double)CONCAT44(local_c8._4_4_,iVar17);
        local_c0 = (double)CONCAT44(local_c0._4_4_,iVar19);
        local_88 = (double)CONCAT44(local_88._4_4_,(int)uVar14);
        uVar14 = uVar14 & 0xffffffff;
        iVar8 = 1;
        while (iVar8 < iVar5) {
          local_d0 = (double)CONCAT44(local_d0._4_4_,iVar8);
          iVar8 = 0;
          while( true ) {
            iVar6 = (int)uVar14;
            iVar11 = (int)local_120;
            if (l <= iVar8 + 1) break;
            hex[0] = iVar19 + iVar8;
            hex[1] = iVar19 + iVar8 + 1;
            hex[3] = iVar11 + iVar8;
            hex[2] = iVar11 + 1 + iVar8;
            hex[4] = iVar6 + iVar8;
            hex[5] = iVar6 + 1 + iVar8;
            hex[7] = iVar8 + iVar17;
            hex[6] = iVar8 + iVar17 + 1;
            uVar4 = ref_cell_add(local_a8->cell[0xb],hex,&cell);
            uVar20 = (ulong)uVar4;
            iVar8 = iVar8 + 1;
            if (uVar4 != 0) {
              pcVar13 = "hex";
              uVar9 = 0x528;
              goto LAB_0012c6b4;
            }
          }
          uVar14 = (ulong)(uint)(iVar6 + l);
          iVar19 = iVar19 + l;
          iVar17 = iVar17 + l;
          local_120 = (ulong)(uint)(iVar11 + l);
          iVar8 = local_d0._0_4_ + 1;
        }
        iVar8 = (int)local_d8;
        iVar19 = local_c0._0_4_ + iVar8;
        iVar17 = local_c8._0_4_ + iVar8;
        local_120 = (ulong)(uint)(local_80._0_4_ + iVar8);
        uVar14 = (ulong)(uint)(local_88._0_4_ + iVar8);
        iVar8 = local_90._0_4_ + 1;
      }
      quad[4] = 1;
      iVar17 = l * local_98._0_4_;
      iVar5 = 0;
      for (iVar8 = 1; iVar8 < (int)local_a0; iVar8 = iVar8 + 1) {
        iVar11 = 0;
        iVar19 = iVar5;
        while( true ) {
          iVar11 = iVar11 + 1;
          if ((int)uVar18 <= iVar11) break;
          hex[1] = iVar19 + 1;
          hex[3] = iVar19 + l;
          hex[2] = l + 1 + iVar19;
          hex[4] = (int)local_d8 + iVar19;
          hex[5] = (int)local_d8 + 1 + iVar19;
          hex[7] = iVar17 + iVar19;
          hex[6] = iVar17 + 1 + iVar19;
          hex[0] = iVar19;
          quad[0] = iVar19;
          quad[1] = hex[3];
          quad[2] = hex[7];
          quad[3] = hex[4];
          uVar4 = ref_cell_add(local_a8->cell[6],quad,&cell);
          uVar20 = (ulong)uVar4;
          uVar18 = local_b0;
          iVar19 = iVar19 + l;
          if (uVar4 != 0) {
            pcVar13 = "qua";
            uVar9 = 0x534;
            goto LAB_0012c6b4;
          }
        }
        iVar5 = iVar5 + (int)local_d8;
      }
      quad[4] = 2;
      local_d0 = (double)(ulong)(iVar17 - 1);
      local_c8 = (double)(ulong)(iVar17 - 2);
      iVar8 = ((int)uVar18 + 2) * l;
      local_c0 = (double)CONCAT44(local_c0._4_4_,iVar8 + -2);
      local_80 = (double)(ulong)(l * 2 - 2);
      local_88 = (double)(ulong)(l * 2 - 1);
      local_90 = (REF_DBL)((ulong)local_90 & 0xffffffff00000000);
      for (local_b4 = 1; local_b4 < (int)local_a0; local_b4 = local_b4 + 1) {
        iVar19 = 0;
        iVar5 = local_90._0_4_;
        while( true ) {
          iVar19 = iVar19 + 1;
          if ((int)local_b0 <= iVar19) break;
          hex[0] = l + -2 + iVar5;
          hex[1] = (int)local_50 + iVar5;
          hex[2] = SUB84(local_88,0) + iVar5;
          hex[3] = SUB84(local_80,0) + iVar5;
          hex[4] = SUB84(local_c8,0) + iVar5;
          hex[5] = SUB84(local_d0,0) + iVar5;
          hex[6] = iVar8 + -1 + iVar5;
          hex[7] = iVar5 + local_c0._0_4_;
          quad[0] = hex[2];
          quad[1] = hex[1];
          quad[2] = hex[5];
          quad[3] = hex[6];
          uVar4 = ref_cell_add(local_a8->cell[6],quad,&cell);
          uVar20 = (ulong)uVar4;
          iVar5 = iVar5 + l;
          if (uVar4 != 0) {
            pcVar13 = "qua";
            uVar9 = 0x540;
            goto LAB_0012c6b4;
          }
        }
        local_90 = (REF_DBL)CONCAT44(local_90._4_4_,local_90._0_4_ + (int)local_d8);
      }
      quad[4] = 3;
      iVar8 = 0;
      uVar14 = local_d8;
      uVar10 = uVar15;
      for (local_120._0_4_ = 1; (int)local_120 < (int)local_a0; local_120._0_4_ = (int)local_120 + 1
          ) {
        iVar5 = 0;
        while( true ) {
          iVar11 = (int)uVar10;
          iVar19 = (int)uVar14;
          if (l <= iVar5 + 1) break;
          hex[0] = iVar8 + iVar5;
          hex[1] = iVar8 + iVar5 + 1;
          hex[3] = iVar11 + iVar5;
          hex[2] = iVar11 + 1 + iVar5;
          hex[4] = iVar19 + iVar5;
          hex[5] = iVar19 + iVar5 + 1;
          hex[7] = iVar5 + iVar17;
          hex[6] = iVar5 + iVar17 + 1;
          quad[0] = hex[1];
          quad[1] = hex[0];
          quad[2] = hex[4];
          quad[3] = hex[5];
          uVar4 = ref_cell_add(local_a8->cell[6],quad,&cell);
          uVar20 = (ulong)uVar4;
          iVar5 = iVar5 + 1;
          if (uVar4 != 0) {
            pcVar13 = "qua";
            uVar9 = 0x54c;
            goto LAB_0012c6b4;
          }
        }
        iVar5 = (int)local_d8;
        iVar8 = iVar8 + iVar5;
        iVar17 = iVar17 + iVar5;
        uVar10 = (ulong)(uint)(iVar11 + iVar5);
        uVar14 = (ulong)(uint)(iVar19 + iVar5);
      }
      quad[4] = 4;
      iVar8 = (int)local_b0;
      iVar17 = (iVar8 + -2) * l;
      uVar4 = (int)local_70 * l;
      iVar19 = (iVar8 * 2 + -2) * l;
      iVar5 = (iVar8 * 2 + -1) * l;
      iVar8 = 1;
      while( true ) {
        local_70 = (ulong)uVar4;
        if ((int)local_a0 <= iVar8) break;
        iVar11 = 0;
        while( true ) {
          iVar6 = (int)local_70;
          if (l <= iVar11 + 1) break;
          hex[0] = iVar17 + iVar11;
          hex[1] = iVar17 + iVar11 + 1;
          hex[3] = iVar6 + iVar11;
          hex[2] = iVar6 + 1 + iVar11;
          hex[4] = iVar19 + iVar11;
          hex[5] = iVar19 + iVar11 + 1;
          hex[7] = iVar11 + iVar5;
          hex[6] = iVar11 + iVar5 + 1;
          quad[0] = hex[3];
          quad[1] = hex[2];
          quad[2] = hex[6];
          quad[3] = hex[7];
          uVar4 = ref_cell_add(local_a8->cell[6],quad,&cell);
          uVar20 = (ulong)uVar4;
          iVar11 = iVar11 + 1;
          if (uVar4 != 0) {
            pcVar13 = "qua";
            uVar9 = 0x558;
            goto LAB_0012c6b4;
          }
        }
        iVar8 = iVar8 + 1;
        iVar11 = (int)local_d8;
        iVar19 = iVar19 + iVar11;
        iVar17 = iVar17 + iVar11;
        iVar5 = iVar5 + iVar11;
        uVar4 = iVar6 + iVar11;
      }
      quad[4] = 7;
      iVar5 = 0;
      iVar8 = 0;
      if (0 < (int)local_68) {
        iVar8 = (int)local_68;
      }
      iVar17 = l * local_98._0_4_;
      local_d0 = (double)CONCAT44(local_d0._4_4_,1);
      uVar20 = local_d8;
      while( true ) {
        if ((int)local_b0 <= local_d0._0_4_) break;
        iVar19 = 0;
        while( true ) {
          iVar6 = (int)uVar15;
          iVar11 = (int)uVar20;
          if (iVar8 == iVar19) break;
          hex[0] = iVar5 + iVar19;
          hex[1] = iVar5 + iVar19 + 1;
          hex[3] = iVar6 + iVar19;
          hex[2] = iVar6 + 1 + iVar19;
          hex[4] = iVar11 + iVar19;
          hex[5] = iVar11 + 1 + iVar19;
          hex[7] = iVar17 + iVar19;
          hex[6] = iVar17 + 1 + iVar19;
          quad[0] = hex[0];
          quad[1] = hex[1];
          quad[2] = hex[2];
          quad[3] = hex[3];
          uVar4 = ref_cell_add(local_a8->cell[6],quad,&cell);
          iVar19 = iVar19 + 1;
          if (uVar4 != 0) {
            uVar20 = (ulong)uVar4;
            pcVar13 = "qua";
            uVar9 = 0x564;
            goto LAB_0012c6b4;
          }
        }
        local_d0 = (double)CONCAT44(local_d0._4_4_,local_d0._0_4_ + 1);
        iVar5 = iVar5 + l;
        uVar20 = (ulong)(uint)(iVar11 + l);
        uVar15 = (ulong)(uint)(iVar6 + l);
        iVar17 = iVar17 + l;
      }
      quad[4] = 5;
      local_98 = (REF_DBL)CONCAT44(local_98._4_4_,local_98._0_4_ * l);
      local_d0 = (double)((ulong)local_d0 & 0xffffffff00000000);
      local_c8 = (double)CONCAT44(local_c8._4_4_,l);
      local_c0 = (double)CONCAT44(local_c0._4_4_,(int)local_d8);
      for (local_120._0_4_ = 1; (int)local_120 < (int)local_b0; local_120._0_4_ = (int)local_120 + 1
          ) {
        iVar11 = 1;
        iVar8 = local_d0._0_4_;
        iVar5 = local_c8._0_4_;
        iVar17 = local_c0._0_4_;
        iVar19 = local_98._0_4_;
        while (iVar6 = (int)local_68, iVar6 + iVar11 < l) {
          hex[0] = iVar6 + iVar8;
          hex[1] = iVar6 + iVar8 + 1;
          hex[3] = iVar6 + iVar5;
          hex[2] = iVar6 + 1 + iVar5;
          hex[4] = iVar6 + iVar17;
          hex[5] = iVar6 + 1 + iVar17;
          hex[7] = iVar6 + iVar19;
          hex[6] = iVar6 + 1 + iVar19;
          quad[0] = hex[0];
          quad[1] = hex[1];
          quad[2] = hex[2];
          quad[3] = hex[3];
          uVar4 = ref_cell_add(local_a8->cell[6],quad,&cell);
          iVar8 = iVar8 + 1;
          iVar17 = iVar17 + 1;
          iVar5 = iVar5 + 1;
          iVar19 = iVar19 + 1;
          iVar11 = iVar11 + 1;
          if (uVar4 != 0) {
            uVar20 = (ulong)uVar4;
            pcVar13 = "qua";
            uVar9 = 0x570;
            goto LAB_0012c6b4;
          }
        }
        local_d0 = (double)CONCAT44(local_d0._4_4_,local_d0._0_4_ + l);
        local_c0 = (double)CONCAT44(local_c0._4_4_,local_c0._0_4_ + l);
        local_c8 = (double)CONCAT44(local_c8._4_4_,local_c8._0_4_ + l);
        local_98 = (REF_DBL)CONCAT44(local_98._4_4_,local_98._0_4_ + l);
      }
      quad[4] = 6;
      iVar5 = (int)local_d8 * (int)local_78;
      iVar8 = (int)local_a0 + -2;
      iVar19 = (int)local_d8 * iVar8;
      uVar4 = ((int)local_78 * (int)local_b0 + 1) * l;
      iVar17 = (iVar8 * (int)local_b0 + 1) * l;
      iVar8 = 1;
      while( true ) {
        local_78 = (ulong)uVar4;
        if ((int)local_b0 <= iVar8) break;
        iVar11 = 0;
        while( true ) {
          iVar6 = (int)local_78;
          if (l <= iVar11 + 1) break;
          hex[0] = iVar19 + iVar11;
          hex[1] = iVar19 + iVar11 + 1;
          hex[3] = iVar17 + iVar11;
          hex[2] = iVar17 + 1 + iVar11;
          hex[4] = iVar5 + iVar11;
          hex[5] = iVar5 + 1 + iVar11;
          hex[7] = iVar11 + iVar6;
          hex[6] = iVar11 + iVar6 + 1;
          quad[0] = hex[5];
          quad[1] = hex[4];
          quad[2] = hex[7];
          quad[3] = hex[6];
          uVar4 = ref_cell_add(local_a8->cell[6],quad,&cell);
          uVar20 = (ulong)uVar4;
          iVar11 = iVar11 + 1;
          if (uVar4 != 0) {
            pcVar13 = "qua";
            uVar9 = 0x57c;
            goto LAB_0012c6b4;
          }
        }
        iVar8 = iVar8 + 1;
        iVar5 = iVar5 + l;
        iVar19 = iVar19 + l;
        uVar4 = iVar6 + l;
        iVar17 = iVar17 + l;
      }
      uVar4 = ref_node_initialize_n_global(local_48,(long)((int)local_d8 * (int)local_a0));
      if (uVar4 == 0) {
        return 0;
      }
      uVar20 = (ulong)uVar4;
      pcVar13 = "init glob";
      uVar9 = 0x57f;
    }
    else {
      uVar4 = ref_node_initialize_n_global(ref_node,(long)(m * l * iVar8));
      if (uVar4 == 0) {
        return 0;
      }
      uVar20 = (ulong)uVar4;
      pcVar13 = "init glob";
      uVar9 = 0x50a;
    }
  }
  else {
    uVar20 = (ulong)uVar3;
    pcVar13 = "create";
    uVar9 = 0x505;
  }
LAB_0012c6b4:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar9,
         "ref_fixture_hex_brick_args_grid",uVar20,pcVar13);
  return (REF_STATUS)uVar20;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_hex_brick_args_grid(
    REF_GRID *ref_grid_ptr, REF_MPI ref_mpi, REF_DBL x0, REF_DBL x1, REF_DBL y0,
    REF_DBL y1, REF_DBL z0, REF_DBL z1, REF_INT l, REF_INT m, REF_INT n,
    REF_INT l0) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global, node, hex[8], cell;
  REF_INT quad[5];

  REF_INT i, j, k;
  REF_DBL dx, dy, dz;

  l0 = MAX(0, l0);
  l0 = MIN(l0, l - 1);

  dx = (x1 - x0) / ((REF_DBL)(l - 1));
  dy = (y1 - y0) / ((REF_DBL)(m - 1));
  dz = (z1 - z0) / ((REF_DBL)(n - 1));

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  if (!ref_mpi_once(ref_grid_mpi(ref_grid))) {
    RSS(ref_node_initialize_n_global(ref_node, l * m * n), "init glob");
    return REF_SUCCESS;
  }

#define ijk2node(i, j, k, l, m, n) ((i) + (j) * (l) + (k) * (l) * (m))

  for (k = 0; k < n; k++)
    for (j = 0; j < m; j++)
      for (i = 0; i < l; i++) {
        global = ijk2node(i, j, k, l, m, n);
        RSS(ref_node_add(ref_node, global, &node), "node");
        ref_node_xyz(ref_node, 0, node) = x0 + dx * (REF_DBL)i;
        ref_node_xyz(ref_node, 1, node) = y0 + dy * (REF_DBL)j;
        ref_node_xyz(ref_node, 2, node) = z0 + dz * (REF_DBL)k;
      }

#define ijk2hex(i, j, k, l, m, n, hex)                     \
  (hex)[0] = ijk2node((i)-1, (j)-1, (k)-1, (l), (m), (n)); \
  (hex)[1] = ijk2node((i), (j)-1, (k)-1, (l), (m), (n));   \
  (hex)[2] = ijk2node((i), (j), (k)-1, (l), (m), (n));     \
  (hex)[3] = ijk2node((i)-1, (j), (k)-1, (l), (m), (n));   \
  (hex)[4] = ijk2node((i)-1, (j)-1, (k), (l), (m), (n));   \
  (hex)[5] = ijk2node((i), (j)-1, (k), (l), (m), (n));     \
  (hex)[6] = ijk2node((i), (j), (k), (l), (m), (n));       \
  (hex)[7] = ijk2node((i)-1, (j), (k), (l), (m), (n));

  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++)
      for (i = 1; i < l; i++) {
        ijk2hex(i, j, k, l, m, n, hex);
        RSS(ref_cell_add(ref_grid_hex(ref_grid), hex, &cell), "hex");
      }

  quad[4] = 1;
  i = 1;
  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[3];
      quad[2] = hex[7];
      quad[3] = hex[4];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 2;
  i = l - 1;
  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[2];
      quad[1] = hex[1];
      quad[2] = hex[5];
      quad[3] = hex[6];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 3;
  j = 1;
  for (k = 1; k < n; k++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[1];
      quad[1] = hex[0];
      quad[2] = hex[4];
      quad[3] = hex[5];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 4;
  j = m - 1;
  for (k = 1; k < n; k++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[3];
      quad[1] = hex[2];
      quad[2] = hex[6];
      quad[3] = hex[7];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 7;
  k = 1;
  for (j = 1; j < m; j++)
    for (i = 1; i < l0 + 1; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[1];
      quad[2] = hex[2];
      quad[3] = hex[3];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 5;
  k = 1;
  for (j = 1; j < m; j++)
    for (i = l0 + 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[1];
      quad[2] = hex[2];
      quad[3] = hex[3];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 6;
  k = n - 1;
  for (j = 1; j < m; j++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[5];
      quad[1] = hex[4];
      quad[2] = hex[7];
      quad[3] = hex[6];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  RSS(ref_node_initialize_n_global(ref_node, l * m * n), "init glob");

  return REF_SUCCESS;
}